

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

_HashNode * __thiscall SQTable::_Get(SQTable *this,SQObjectPtr *key)

{
  SQObjectType SVar1;
  SQGenerator *key_00;
  _HashNode *p_Var2;
  SQHash SVar3;
  
  SVar1 = (key->super_SQObject)._type;
  if (SVar1 == OT_NULL) {
    return (_HashNode *)0x0;
  }
  if (SVar1 == OT_STRING) {
    key_00 = (key->super_SQObject)._unVal.pGenerator;
    p_Var2 = _GetStr(this,(SQRawObjectVal)key_00,
                     (ulong)((key_00->_closure).super_SQObject._type & this->_numofnodes_minus_one))
    ;
    return p_Var2;
  }
  SVar3 = HashObj(&key->super_SQObject);
  p_Var2 = _Get(this,key,(ulong)((uint)SVar3 & this->_numofnodes_minus_one));
  return p_Var2;
}

Assistant:

SQTable::_HashNode *SQTable::_Get(const SQObjectPtr &key) const
{
    if(sq_type(key) == OT_NULL)
        return nullptr;

    if (sq_type(key) == OT_STRING)
        return _GetStr(_rawval(key), _string(key)->_hash & _numofnodes_minus_one);
    else
        return _Get(key, HashObj(key) & _numofnodes_minus_one);
}